

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  int iVar6;
  undefined4 uVar7;
  size_t sVar8;
  undefined8 uVar9;
  Scene *pSVar10;
  float **ppfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  int iVar29;
  int iVar30;
  undefined4 uVar31;
  long lVar32;
  ulong uVar33;
  size_t sVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar41;
  long lVar42;
  ulong unaff_R13;
  size_t mask;
  Scene *scene;
  ulong uVar43;
  float fVar44;
  uint uVar45;
  float fVar46;
  float fVar56;
  float fVar59;
  vint4 bi;
  uint uVar57;
  uint uVar60;
  float fVar62;
  uint uVar63;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar58;
  float fVar61;
  float fVar64;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar55;
  float fVar65;
  int iVar72;
  int iVar74;
  vint4 bi_1;
  float fVar73;
  float fVar75;
  int iVar76;
  float fVar77;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar78;
  uint uVar79;
  float fVar80;
  float fVar86;
  float fVar89;
  vint4 ai;
  uint uVar87;
  uint uVar90;
  float fVar92;
  uint uVar93;
  StackItemT<embree::NodeRefPtr<4>_> SVar81;
  float fVar88;
  float fVar91;
  float fVar94;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar95;
  float fVar99;
  float fVar100;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar96;
  float fVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar102;
  float fVar107;
  float fVar108;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  vbool<4> valid;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  Geometry *local_11d0;
  ulong local_11c8;
  long local_11c0;
  ulong local_11b8;
  undefined8 *local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1168;
  undefined8 uStack_1160;
  vfloat<4> tNear;
  float local_10f8 [4];
  float local_10e8 [4];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8 [4];
  undefined1 local_1098 [16];
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar116;
  
  pSVar41 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1028 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1038 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1048 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1068 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1078 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar37 = uVar38 ^ 0x10;
  uVar43 = local_11a8 ^ 0x10;
  local_11a0 = uVar36 ^ 0x10;
  local_1088 = (tray->tnear).field_0.i[k];
  iVar30 = (tray->tfar).field_0.i[k];
  local_11b0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  fStack_1074 = local_1078;
  fStack_1070 = local_1078;
  fStack_106c = local_1078;
  iStack_1084 = local_1088;
  iStack_1080 = local_1088;
  iStack_107c = local_1088;
  uVar35 = local_11a8;
  fVar126 = local_1028;
  fVar116 = local_1028;
  fVar120 = local_1028;
  fVar127 = local_1028;
  fVar80 = local_1038;
  fVar65 = local_1038;
  fVar46 = local_1038;
  fVar88 = local_1038;
  fVar73 = local_1048;
  fVar58 = local_1048;
  fVar91 = local_1048;
  fVar75 = local_1048;
  fVar61 = local_1058;
  fVar94 = local_1058;
  fVar77 = local_1058;
  fVar64 = local_1058;
  fVar95 = local_1068;
  fVar99 = local_1068;
  fVar100 = local_1068;
  fVar101 = local_1068;
  fVar102 = local_1078;
  fVar107 = local_1078;
  fVar108 = local_1078;
  fVar109 = local_1078;
  iVar138 = local_1088;
  iVar139 = local_1088;
  iVar140 = local_1088;
  iVar141 = local_1088;
  iVar72 = iVar30;
  iVar74 = iVar30;
  iVar76 = iVar30;
  do {
    do {
      do {
        if (pSVar41 == stack) {
          return;
        }
        pSVar28 = pSVar41 + -1;
        pSVar41 = pSVar41 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar28->dist &&
               (float)pSVar28->dist != *(float *)(ray + k * 4 + 0x80));
      sVar34 = (pSVar41->ptr).ptr;
      do {
        if ((sVar34 & 8) == 0) {
          pfVar4 = (float *)(sVar34 + 0x20 + uVar38);
          fVar44 = (*pfVar4 - fVar126) * fVar61;
          fVar56 = (pfVar4[1] - fVar116) * fVar94;
          fVar59 = (pfVar4[2] - fVar120) * fVar77;
          fVar62 = (pfVar4[3] - fVar127) * fVar64;
          pfVar4 = (float *)(sVar34 + 0x20 + uVar35);
          fVar78 = (*pfVar4 - fVar80) * fVar95;
          fVar86 = (pfVar4[1] - fVar65) * fVar99;
          fVar89 = (pfVar4[2] - fVar46) * fVar100;
          fVar92 = (pfVar4[3] - fVar88) * fVar101;
          uVar79 = (uint)((int)fVar78 < (int)fVar44) * (int)fVar44 |
                   (uint)((int)fVar78 >= (int)fVar44) * (int)fVar78;
          uVar87 = (uint)((int)fVar86 < (int)fVar56) * (int)fVar56 |
                   (uint)((int)fVar86 >= (int)fVar56) * (int)fVar86;
          uVar90 = (uint)((int)fVar89 < (int)fVar59) * (int)fVar59 |
                   (uint)((int)fVar89 >= (int)fVar59) * (int)fVar89;
          uVar93 = (uint)((int)fVar92 < (int)fVar62) * (int)fVar62 |
                   (uint)((int)fVar92 >= (int)fVar62) * (int)fVar92;
          pfVar4 = (float *)(sVar34 + 0x20 + uVar36);
          fVar44 = (*pfVar4 - fVar73) * fVar102;
          fVar56 = (pfVar4[1] - fVar58) * fVar107;
          fVar59 = (pfVar4[2] - fVar91) * fVar108;
          fVar62 = (pfVar4[3] - fVar75) * fVar109;
          uVar45 = (uint)((int)fVar44 < iVar138) * iVar138 |
                   (uint)((int)fVar44 >= iVar138) * (int)fVar44;
          uVar57 = (uint)((int)fVar56 < iVar139) * iVar139 |
                   (uint)((int)fVar56 >= iVar139) * (int)fVar56;
          uVar60 = (uint)((int)fVar59 < iVar140) * iVar140 |
                   (uint)((int)fVar59 >= iVar140) * (int)fVar59;
          uVar63 = (uint)((int)fVar62 < iVar141) * iVar141 |
                   (uint)((int)fVar62 >= iVar141) * (int)fVar62;
          tNear.field_0.i[0] =
               ((int)uVar45 < (int)uVar79) * uVar79 | ((int)uVar45 >= (int)uVar79) * uVar45;
          tNear.field_0.i[1] =
               ((int)uVar57 < (int)uVar87) * uVar87 | ((int)uVar57 >= (int)uVar87) * uVar57;
          tNear.field_0.i[2] =
               ((int)uVar60 < (int)uVar90) * uVar90 | ((int)uVar60 >= (int)uVar90) * uVar60;
          tNear.field_0.i[3] =
               ((int)uVar63 < (int)uVar93) * uVar93 | ((int)uVar63 >= (int)uVar93) * uVar63;
          pfVar4 = (float *)(sVar34 + 0x20 + uVar37);
          fVar44 = (*pfVar4 - fVar126) * fVar61;
          fVar56 = (pfVar4[1] - fVar116) * fVar94;
          fVar59 = (pfVar4[2] - fVar120) * fVar77;
          fVar62 = (pfVar4[3] - fVar127) * fVar64;
          pfVar4 = (float *)(sVar34 + 0x20 + uVar43);
          fVar78 = (*pfVar4 - fVar80) * fVar95;
          fVar86 = (pfVar4[1] - fVar65) * fVar99;
          fVar89 = (pfVar4[2] - fVar46) * fVar100;
          fVar92 = (pfVar4[3] - fVar88) * fVar101;
          uVar79 = (uint)((int)fVar44 < (int)fVar78) * (int)fVar44 |
                   (uint)((int)fVar44 >= (int)fVar78) * (int)fVar78;
          uVar87 = (uint)((int)fVar56 < (int)fVar86) * (int)fVar56 |
                   (uint)((int)fVar56 >= (int)fVar86) * (int)fVar86;
          uVar90 = (uint)((int)fVar59 < (int)fVar89) * (int)fVar59 |
                   (uint)((int)fVar59 >= (int)fVar89) * (int)fVar89;
          uVar93 = (uint)((int)fVar62 < (int)fVar92) * (int)fVar62 |
                   (uint)((int)fVar62 >= (int)fVar92) * (int)fVar92;
          pfVar4 = (float *)(sVar34 + 0x20 + local_11a0);
          fVar44 = (*pfVar4 - fVar73) * fVar102;
          fVar56 = (pfVar4[1] - fVar58) * fVar107;
          fVar59 = (pfVar4[2] - fVar91) * fVar108;
          fVar62 = (pfVar4[3] - fVar75) * fVar109;
          uVar45 = (uint)(iVar30 < (int)fVar44) * iVar30 |
                   (uint)(iVar30 >= (int)fVar44) * (int)fVar44;
          uVar57 = (uint)(iVar72 < (int)fVar56) * iVar72 |
                   (uint)(iVar72 >= (int)fVar56) * (int)fVar56;
          uVar60 = (uint)(iVar74 < (int)fVar59) * iVar74 |
                   (uint)(iVar74 >= (int)fVar59) * (int)fVar59;
          uVar63 = (uint)(iVar76 < (int)fVar62) * iVar76 |
                   (uint)(iVar76 >= (int)fVar62) * (int)fVar62;
          auVar67._0_4_ =
               -(uint)((int)(((int)uVar79 < (int)uVar45) * uVar79 |
                            ((int)uVar79 >= (int)uVar45) * uVar45) < tNear.field_0.i[0]);
          auVar67._4_4_ =
               -(uint)((int)(((int)uVar87 < (int)uVar57) * uVar87 |
                            ((int)uVar87 >= (int)uVar57) * uVar57) < tNear.field_0.i[1]);
          auVar67._8_4_ =
               -(uint)((int)(((int)uVar90 < (int)uVar60) * uVar90 |
                            ((int)uVar90 >= (int)uVar60) * uVar60) < tNear.field_0.i[2]);
          auVar67._12_4_ =
               -(uint)((int)(((int)uVar93 < (int)uVar63) * uVar93 |
                            ((int)uVar93 >= (int)uVar63) * uVar63) < tNear.field_0.i[3]);
          uVar45 = movmskps((int)local_11a0,auVar67);
          unaff_R13 = ((ulong)uVar45 ^ 0xf) & 0xff;
        }
        if ((sVar34 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar29 = 4;
          }
          else {
            uVar33 = sVar34 & 0xfffffffffffffff0;
            lVar40 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            iVar29 = 0;
            sVar34 = *(size_t *)(uVar33 + lVar40 * 8);
            uVar39 = unaff_R13 - 1 & unaff_R13;
            if (uVar39 != 0) {
              uVar45 = tNear.field_0.i[lVar40];
              lVar40 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              sVar8 = *(size_t *)(uVar33 + lVar40 * 8);
              uVar57 = tNear.field_0.i[lVar40];
              uVar39 = uVar39 - 1 & uVar39;
              if (uVar39 == 0) {
                if (uVar45 < uVar57) {
                  (pSVar41->ptr).ptr = sVar8;
                  pSVar41->dist = uVar57;
                  pSVar41 = pSVar41 + 1;
                }
                else {
                  (pSVar41->ptr).ptr = sVar34;
                  pSVar41->dist = uVar45;
                  sVar34 = sVar8;
                  pSVar41 = pSVar41 + 1;
                }
              }
              else {
                auVar82._8_4_ = uVar45;
                auVar82._0_8_ = sVar34;
                auVar82._12_4_ = 0;
                auVar111._8_4_ = uVar57;
                auVar111._0_8_ = sVar8;
                auVar111._12_4_ = 0;
                lVar40 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                uVar9 = *(undefined8 *)(uVar33 + lVar40 * 8);
                iVar6 = tNear.field_0.i[lVar40];
                auVar114._8_4_ = iVar6;
                auVar114._0_8_ = uVar9;
                auVar114._12_4_ = 0;
                auVar105._8_4_ = -(uint)((int)uVar45 < (int)uVar57);
                uVar39 = uVar39 - 1 & uVar39;
                if (uVar39 == 0) {
                  auVar105._4_4_ = auVar105._8_4_;
                  auVar105._0_4_ = auVar105._8_4_;
                  auVar105._12_4_ = auVar105._8_4_;
                  auVar103._8_4_ = uVar57;
                  auVar103._0_8_ = sVar8;
                  auVar103._12_4_ = 0;
                  auVar104 = blendvps(auVar103,auVar82,auVar105);
                  auVar67 = blendvps(auVar82,auVar111,auVar105);
                  auVar47._8_4_ = -(uint)(auVar104._8_4_ < iVar6);
                  auVar47._4_4_ = auVar47._8_4_;
                  auVar47._0_4_ = auVar47._8_4_;
                  auVar47._12_4_ = auVar47._8_4_;
                  auVar110._8_4_ = iVar6;
                  auVar110._0_8_ = uVar9;
                  auVar110._12_4_ = 0;
                  auVar111 = blendvps(auVar110,auVar104,auVar47);
                  auVar82 = blendvps(auVar104,auVar114,auVar47);
                  auVar48._8_4_ = -(uint)(auVar67._8_4_ < auVar82._8_4_);
                  auVar48._4_4_ = auVar48._8_4_;
                  auVar48._0_4_ = auVar48._8_4_;
                  auVar48._12_4_ = auVar48._8_4_;
                  SVar96 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar67,auVar48);
                  SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar67,auVar82,auVar48);
                  *pSVar41 = SVar81;
                  pSVar41[1] = SVar96;
                  sVar34 = auVar111._0_8_;
                  pSVar41 = pSVar41 + 2;
                }
                else {
                  lVar40 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                    }
                  }
                  auVar104._4_4_ = auVar105._8_4_;
                  auVar104._0_4_ = auVar105._8_4_;
                  auVar104._8_4_ = auVar105._8_4_;
                  auVar104._12_4_ = auVar105._8_4_;
                  auVar105 = blendvps(auVar111,auVar82,auVar104);
                  auVar67 = blendvps(auVar82,auVar111,auVar104);
                  auVar113._8_4_ = tNear.field_0.i[lVar40];
                  auVar113._0_8_ = *(undefined8 *)(uVar33 + lVar40 * 8);
                  auVar113._12_4_ = 0;
                  auVar49._8_4_ = -(uint)(iVar6 < tNear.field_0.i[lVar40]);
                  auVar49._4_4_ = auVar49._8_4_;
                  auVar49._0_4_ = auVar49._8_4_;
                  auVar49._12_4_ = auVar49._8_4_;
                  auVar111 = blendvps(auVar113,auVar114,auVar49);
                  auVar82 = blendvps(auVar114,auVar113,auVar49);
                  auVar50._8_4_ = -(uint)(auVar67._8_4_ < auVar82._8_4_);
                  auVar50._4_4_ = auVar50._8_4_;
                  auVar50._0_4_ = auVar50._8_4_;
                  auVar50._12_4_ = auVar50._8_4_;
                  auVar114 = blendvps(auVar82,auVar67,auVar50);
                  SVar81 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar67,auVar82,auVar50);
                  auVar51._8_4_ = -(uint)(auVar105._8_4_ < auVar111._8_4_);
                  auVar51._4_4_ = auVar51._8_4_;
                  auVar51._0_4_ = auVar51._8_4_;
                  auVar51._12_4_ = auVar51._8_4_;
                  auVar67 = blendvps(auVar111,auVar105,auVar51);
                  auVar82 = blendvps(auVar105,auVar111,auVar51);
                  auVar52._8_4_ = -(uint)(auVar82._8_4_ < auVar114._8_4_);
                  auVar52._4_4_ = auVar52._8_4_;
                  auVar52._0_4_ = auVar52._8_4_;
                  auVar52._12_4_ = auVar52._8_4_;
                  SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar114,auVar82,auVar52);
                  SVar96 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar82,auVar114,auVar52);
                  *pSVar41 = SVar81;
                  pSVar41[1] = SVar96;
                  pSVar41[2] = SVar112;
                  sVar34 = auVar67._0_8_;
                  pSVar41 = pSVar41 + 3;
                }
              }
            }
          }
        }
        else {
          iVar29 = 6;
        }
      } while (iVar29 == 0);
    } while (iVar29 != 6);
    lVar40 = (ulong)((uint)sVar34 & 0xf) - 8;
    if (lVar40 != 0) {
      uVar35 = sVar34 & 0xfffffffffffffff0;
      lVar42 = 0;
      do {
        lVar32 = lVar42 * 0x50;
        pSVar10 = context->scene;
        ppfVar11 = (pSVar10->vertices).items;
        pfVar12 = ppfVar11[*(uint *)(uVar35 + 0x30 + lVar32)];
        pfVar4 = pfVar12 + *(uint *)(uVar35 + lVar32);
        fVar80 = *pfVar4;
        fVar65 = pfVar4[1];
        fVar46 = pfVar4[2];
        pfVar4 = pfVar12 + *(uint *)(uVar35 + 0x10 + lVar32);
        pfVar12 = pfVar12 + *(uint *)(uVar35 + 0x20 + lVar32);
        pfVar13 = ppfVar11[*(uint *)(uVar35 + 0x34 + lVar32)];
        pfVar1 = pfVar13 + *(uint *)(uVar35 + 4 + lVar32);
        fVar88 = *pfVar1;
        fVar73 = pfVar1[1];
        fVar58 = pfVar1[2];
        pfVar1 = pfVar13 + *(uint *)(uVar35 + 0x14 + lVar32);
        pfVar13 = pfVar13 + *(uint *)(uVar35 + 0x24 + lVar32);
        pfVar14 = ppfVar11[*(uint *)(uVar35 + 0x38 + lVar32)];
        pfVar2 = pfVar14 + *(uint *)(uVar35 + 8 + lVar32);
        fVar91 = *pfVar2;
        fVar75 = pfVar2[1];
        fVar61 = pfVar2[2];
        pfVar2 = pfVar14 + *(uint *)(uVar35 + 0x18 + lVar32);
        pfVar14 = pfVar14 + *(uint *)(uVar35 + 0x28 + lVar32);
        pfVar15 = ppfVar11[*(uint *)(uVar35 + 0x3c + lVar32)];
        pfVar3 = pfVar15 + *(uint *)(uVar35 + 0xc + lVar32);
        fVar94 = *pfVar3;
        fVar77 = pfVar3[1];
        fVar64 = pfVar3[2];
        pfVar3 = pfVar15 + *(uint *)(uVar35 + 0x1c + lVar32);
        pfVar15 = pfVar15 + *(uint *)(uVar35 + 0x2c + lVar32);
        puVar5 = (undefined8 *)(uVar35 + 0x30 + lVar32);
        local_1018 = *puVar5;
        uStack_1010 = puVar5[1];
        puVar5 = (undefined8 *)(uVar35 + 0x40 + lVar32);
        local_1168 = *puVar5;
        uStack_1160 = puVar5[1];
        fVar78 = fVar80 - *pfVar4;
        fVar86 = fVar88 - *pfVar1;
        fVar89 = fVar91 - *pfVar2;
        fVar92 = fVar94 - *pfVar3;
        fVar121 = fVar65 - pfVar4[1];
        fVar122 = fVar73 - pfVar1[1];
        fVar123 = fVar75 - pfVar2[1];
        fVar124 = fVar77 - pfVar3[1];
        fVar125 = fVar46 - pfVar4[2];
        fVar128 = fVar58 - pfVar1[2];
        fVar130 = fVar61 - pfVar2[2];
        fVar132 = fVar64 - pfVar3[2];
        fVar102 = *pfVar12 - fVar80;
        fVar107 = *pfVar13 - fVar88;
        fVar108 = *pfVar14 - fVar91;
        fVar109 = *pfVar15 - fVar94;
        fVar44 = pfVar12[1] - fVar65;
        fVar56 = pfVar13[1] - fVar73;
        fVar59 = pfVar14[1] - fVar75;
        fVar62 = pfVar15[1] - fVar77;
        fVar95 = pfVar12[2] - fVar46;
        fVar99 = pfVar13[2] - fVar58;
        fVar100 = pfVar14[2] - fVar61;
        fVar101 = pfVar15[2] - fVar64;
        local_10c8._0_4_ = fVar125 * fVar44 - fVar121 * fVar95;
        local_10c8._4_4_ = fVar128 * fVar56 - fVar122 * fVar99;
        local_10c8._8_4_ = fVar130 * fVar59 - fVar123 * fVar100;
        local_10c8._12_4_ = fVar132 * fVar62 - fVar124 * fVar101;
        fVar126 = *(float *)(ray + k * 4);
        fVar116 = *(float *)(ray + k * 4 + 0x10);
        fVar120 = *(float *)(ray + k * 4 + 0x40);
        fVar127 = *(float *)(ray + k * 4 + 0x50);
        fVar80 = fVar80 - fVar126;
        fVar88 = fVar88 - fVar126;
        fVar91 = fVar91 - fVar126;
        fVar94 = fVar94 - fVar126;
        fVar65 = fVar65 - fVar116;
        fVar73 = fVar73 - fVar116;
        fVar75 = fVar75 - fVar116;
        fVar77 = fVar77 - fVar116;
        fVar134 = fVar80 * fVar127 - fVar65 * fVar120;
        fVar135 = fVar88 * fVar127 - fVar73 * fVar120;
        fVar136 = fVar91 * fVar127 - fVar75 * fVar120;
        fVar137 = fVar94 * fVar127 - fVar77 * fVar120;
        local_10b8._0_4_ = fVar78 * fVar95 - fVar125 * fVar102;
        local_10b8._4_4_ = fVar86 * fVar99 - fVar128 * fVar107;
        local_10b8._8_4_ = fVar89 * fVar100 - fVar130 * fVar108;
        local_10b8._12_4_ = fVar92 * fVar101 - fVar132 * fVar109;
        fVar126 = *(float *)(ray + k * 4 + 0x20);
        fVar116 = *(float *)(ray + k * 4 + 0x60);
        fVar46 = fVar46 - fVar126;
        fVar58 = fVar58 - fVar126;
        fVar61 = fVar61 - fVar126;
        fVar64 = fVar64 - fVar126;
        fVar142 = fVar46 * fVar120 - fVar80 * fVar116;
        fVar143 = fVar58 * fVar120 - fVar88 * fVar116;
        fVar144 = fVar61 * fVar120 - fVar91 * fVar116;
        fVar145 = fVar64 * fVar120 - fVar94 * fVar116;
        local_10a8[0] = fVar121 * fVar102 - fVar78 * fVar44;
        local_10a8[1] = fVar122 * fVar107 - fVar86 * fVar56;
        local_10a8[2] = fVar123 * fVar108 - fVar89 * fVar59;
        local_10a8[3] = fVar124 * fVar109 - fVar92 * fVar62;
        fVar126 = fVar65 * fVar116 - fVar46 * fVar127;
        fVar129 = fVar73 * fVar116 - fVar58 * fVar127;
        fVar131 = fVar75 * fVar116 - fVar61 * fVar127;
        fVar133 = fVar77 * fVar116 - fVar64 * fVar127;
        fVar117 = fVar120 * local_10c8._0_4_ + fVar127 * local_10b8._0_4_ + fVar116 * local_10a8[0];
        fVar118 = fVar120 * local_10c8._4_4_ + fVar127 * local_10b8._4_4_ + fVar116 * local_10a8[1];
        fVar119 = fVar120 * local_10c8._8_4_ + fVar127 * local_10b8._8_4_ + fVar116 * local_10a8[2];
        fVar120 = fVar120 * local_10c8._12_4_ +
                  fVar127 * local_10b8._12_4_ + fVar116 * local_10a8[3];
        uVar45 = (uint)fVar117 & 0x80000000;
        uVar57 = (uint)fVar118 & 0x80000000;
        uVar60 = (uint)fVar119 & 0x80000000;
        uVar63 = (uint)fVar120 & 0x80000000;
        tNear.field_0.i[0] =
             (uint)(fVar102 * fVar126 + fVar44 * fVar142 + fVar95 * fVar134) ^ uVar45;
        tNear.field_0.i[1] =
             (uint)(fVar107 * fVar129 + fVar56 * fVar143 + fVar99 * fVar135) ^ uVar57;
        tNear.field_0.i[2] =
             (uint)(fVar108 * fVar131 + fVar59 * fVar144 + fVar100 * fVar136) ^ uVar60;
        tNear.field_0.i[3] =
             (uint)(fVar109 * fVar133 + fVar62 * fVar145 + fVar101 * fVar137) ^ uVar63;
        fVar127 = (float)((uint)(fVar126 * fVar78 + fVar142 * fVar121 + fVar134 * fVar125) ^ uVar45)
        ;
        fVar95 = (float)((uint)(fVar129 * fVar86 + fVar143 * fVar122 + fVar135 * fVar128) ^ uVar57);
        fVar99 = (float)((uint)(fVar131 * fVar89 + fVar144 * fVar123 + fVar136 * fVar130) ^ uVar60);
        fVar100 = (float)((uint)(fVar133 * fVar92 + fVar145 * fVar124 + fVar137 * fVar132) ^ uVar63)
        ;
        fVar126 = ABS(fVar117);
        fVar116 = ABS(fVar118);
        auVar115._0_8_ = CONCAT44(fVar118,fVar117) & 0x7fffffff7fffffff;
        auVar115._8_4_ = ABS(fVar119);
        auVar115._12_4_ = ABS(fVar120);
        bVar24 = ((0.0 <= fVar127 && 0.0 <= tNear.field_0.v[0]) && fVar117 != 0.0) &&
                 tNear.field_0.v[0] + fVar127 <= fVar126;
        bVar25 = ((0.0 <= fVar95 && 0.0 <= tNear.field_0.v[1]) && fVar118 != 0.0) &&
                 tNear.field_0.v[1] + fVar95 <= fVar116;
        bVar23 = ((0.0 <= fVar99 && 0.0 <= tNear.field_0.v[2]) && fVar119 != 0.0) &&
                 tNear.field_0.v[2] + fVar99 <= auVar115._8_4_;
        bVar22 = ((0.0 <= fVar100 && 0.0 <= tNear.field_0.v[3]) && fVar120 != 0.0) &&
                 tNear.field_0.v[3] + fVar100 <= auVar115._12_4_;
        auVar21._4_4_ = -(uint)bVar25;
        auVar21._0_4_ = -(uint)bVar24;
        auVar21._8_4_ = -(uint)bVar23;
        auVar21._12_4_ = -(uint)bVar22;
        iVar30 = movmskps((int)lVar32,auVar21);
        if (iVar30 != 0) {
          fVar65 = (float)(uVar45 ^ (uint)(fVar80 * local_10c8._0_4_ +
                                          fVar65 * local_10b8._0_4_ + fVar46 * local_10a8[0]));
          fVar46 = (float)(uVar57 ^ (uint)(fVar88 * local_10c8._4_4_ +
                                          fVar73 * local_10b8._4_4_ + fVar58 * local_10a8[1]));
          fVar88 = (float)(uVar60 ^ (uint)(fVar91 * local_10c8._8_4_ +
                                          fVar75 * local_10b8._8_4_ + fVar61 * local_10a8[2]));
          fVar73 = (float)(uVar63 ^ (uint)(fVar94 * local_10c8._12_4_ +
                                          fVar77 * local_10b8._12_4_ + fVar64 * local_10a8[3]));
          fVar120 = *(float *)(ray + k * 4 + 0x30);
          fVar80 = *(float *)(ray + k * 4 + 0x80);
          bVar17 = fVar120 * fVar126 < fVar65;
          bVar18 = fVar120 * fVar116 < fVar46;
          bVar19 = fVar120 * auVar115._8_4_ < fVar88;
          bVar20 = fVar120 * auVar115._12_4_ < fVar73;
          auVar66._4_4_ = -(uint)bVar18;
          auVar66._0_4_ = -(uint)bVar17;
          auVar66._8_4_ = -(uint)bVar19;
          auVar66._12_4_ = -(uint)bVar20;
          valid.field_0.i[0] = -(uint)((fVar65 <= fVar80 * fVar126 && bVar17) && bVar24);
          valid.field_0.i[1] = -(uint)((fVar46 <= fVar80 * fVar116 && bVar18) && bVar25);
          valid.field_0.i[2] = -(uint)((fVar88 <= fVar80 * auVar115._8_4_ && bVar19) && bVar23);
          valid.field_0.i[3] = -(uint)((fVar73 <= fVar80 * auVar115._12_4_ && bVar20) && bVar22);
          iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
          if (iVar30 != 0) {
            auVar67 = rcpps(auVar66,auVar115);
            fVar120 = auVar67._0_4_;
            fVar80 = auVar67._4_4_;
            fVar58 = auVar67._8_4_;
            fVar91 = auVar67._12_4_;
            fVar120 = (1.0 - fVar126 * fVar120) * fVar120 + fVar120;
            fVar80 = (1.0 - fVar116 * fVar80) * fVar80 + fVar80;
            fVar58 = (1.0 - auVar115._8_4_ * fVar58) * fVar58 + fVar58;
            fVar91 = (1.0 - auVar115._12_4_ * fVar91) * fVar91 + fVar91;
            auVar106._0_4_ = fVar65 * fVar120;
            auVar106._4_4_ = fVar46 * fVar80;
            auVar106._8_4_ = fVar88 * fVar58;
            auVar106._12_4_ = fVar73 * fVar91;
            local_10d8 = auVar106;
            local_10f8[0] = tNear.field_0.v[0] * fVar120;
            local_10f8[1] = tNear.field_0.v[1] * fVar80;
            local_10f8[2] = tNear.field_0.v[2] * fVar58;
            local_10f8[3] = tNear.field_0.v[3] * fVar91;
            local_10e8[0] = fVar120 * fVar127;
            local_10e8[1] = fVar80 * fVar95;
            local_10e8[2] = fVar58 * fVar99;
            local_10e8[3] = fVar91 * fVar100;
            auVar82 = blendvps(_DAT_01feb9f0,auVar106,(undefined1  [16])valid.field_0);
            auVar97._4_4_ = auVar82._0_4_;
            auVar97._0_4_ = auVar82._4_4_;
            auVar97._8_4_ = auVar82._12_4_;
            auVar97._12_4_ = auVar82._8_4_;
            auVar67 = minps(auVar97,auVar82);
            auVar68._0_8_ = auVar67._8_8_;
            auVar68._8_4_ = auVar67._0_4_;
            auVar68._12_4_ = auVar67._4_4_;
            auVar67 = minps(auVar68,auVar67);
            uVar45 = -(uint)(auVar67._0_4_ == auVar82._0_4_);
            uVar57 = -(uint)(auVar67._4_4_ == auVar82._4_4_);
            uVar60 = -(uint)(auVar67._8_4_ == auVar82._8_4_);
            uVar63 = -(uint)(auVar67._12_4_ == auVar82._12_4_);
            auVar85._4_4_ = uVar57;
            auVar85._0_4_ = uVar45;
            auVar83._0_4_ = uVar45 & valid.field_0.i[0];
            auVar83._4_4_ = uVar57 & valid.field_0.i[1];
            auVar83._8_4_ = uVar60 & valid.field_0.i[2];
            auVar83._12_4_ = uVar63 & valid.field_0.i[3];
            iVar30 = movmskps(iVar30,auVar83);
            auVar84._8_4_ = 0xffffffff;
            auVar84._0_8_ = 0xffffffffffffffff;
            auVar84._12_4_ = 0xffffffff;
            if (iVar30 != 0) {
              auVar85._8_4_ = uVar60;
              auVar85._12_4_ = uVar63;
              auVar84 = auVar85;
            }
            auVar53._0_4_ = valid.field_0.i[0] & auVar84._0_4_;
            auVar53._4_4_ = valid.field_0.i[1] & auVar84._4_4_;
            auVar53._8_4_ = valid.field_0.i[2] & auVar84._8_4_;
            auVar53._12_4_ = valid.field_0.i[3] & auVar84._12_4_;
            uVar31 = movmskps(iVar30,auVar53);
            uVar33 = CONCAT44((int)((ulong)lVar32 >> 0x20),uVar31);
            local_11c8 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> local_11c8 & 1) == 0; local_11c8 = local_11c8 + 1) {
              }
            }
LAB_002689a2:
            h.geomID.field_0.i[0] = *(uint *)((long)&local_1018 + local_11c8 * 4);
            uVar33 = (ulong)h.geomID.field_0.i[0];
            local_11d0 = (pSVar10->geometries).items[uVar33].ptr;
            if ((local_11d0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[local_11c8] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_11d0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar126 = local_10f8[local_11c8];
                fVar116 = local_10e8[local_11c8];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10d8 + local_11c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10c8 + local_11c8 * 4);
                *(float *)(ray + k * 4 + 0xd0) = local_10a8[local_11c8 - 4];
                *(float *)(ray + k * 4 + 0xe0) = local_10a8[local_11c8];
                *(float *)(ray + k * 4 + 0xf0) = fVar126;
                *(float *)(ray + k * 4 + 0x100) = fVar116;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_1168 + local_11c8 * 4);
                *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0026886c;
              }
              local_1098 = auVar106;
              h.u.field_0.v[0] = local_10f8[local_11c8];
              h.v.field_0.v[0] = local_10e8[local_11c8];
              uVar31 = *(undefined4 *)(local_10c8 + local_11c8 * 4);
              fVar126 = local_10a8[local_11c8 - 4];
              uVar7 = *(undefined4 *)((long)&local_1168 + local_11c8 * 4);
              h.primID.field_0.i[1] = uVar7;
              h.primID.field_0.i[0] = uVar7;
              h.primID.field_0.i[2] = uVar7;
              h.primID.field_0.i[3] = uVar7;
              h.Ng.field_0._4_4_ = uVar31;
              h.Ng.field_0._0_4_ = uVar31;
              h.Ng.field_0._8_4_ = uVar31;
              h.Ng.field_0._12_4_ = uVar31;
              h.Ng.field_0._20_4_ = (int)fVar126;
              h.Ng.field_0._16_4_ = (int)fVar126;
              h.Ng.field_0._24_4_ = (int)fVar126;
              h.Ng.field_0._28_4_ = (int)fVar126;
              fVar126 = local_10a8[local_11c8];
              h.Ng.field_0._36_4_ = (int)fVar126;
              h.Ng.field_0._32_4_ = (int)fVar126;
              h.Ng.field_0._40_4_ = (int)fVar126;
              h.Ng.field_0._44_4_ = (int)fVar126;
              h.u.field_0.v[1] = h.u.field_0.v[0];
              h.u.field_0.v[2] = h.u.field_0.v[0];
              h.u.field_0.v[3] = h.u.field_0.v[0];
              h.v.field_0.v[1] = h.v.field_0.v[0];
              h.v.field_0.v[2] = h.v.field_0.v[0];
              h.v.field_0.v[3] = h.v.field_0.v[0];
              h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
              h.instID[0].field_0.i[0] = context->user->instID[0];
              h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
              h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
              uVar31 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10d8 + local_11c8 * 4);
              local_11e8 = *local_11b0;
              uStack_11e0 = local_11b0[1];
              args.valid = (int *)&local_11e8;
              args.geometryUserPtr = local_11d0->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&h;
              args.N = 4;
              local_11c0 = lVar40;
              local_11b8 = uVar38;
              args.ray = (RTCRayN *)ray;
              if (local_11d0->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_11d0->intersectionFilterN)(&args);
              }
              auVar26._8_8_ = uStack_11e0;
              auVar26._0_8_ = local_11e8;
              if (auVar26 == (undefined1  [16])0x0) {
                auVar69._8_4_ = 0xffffffff;
                auVar69._0_8_ = 0xffffffffffffffff;
                auVar69._12_4_ = 0xffffffff;
                auVar69 = auVar69 ^ _DAT_01febe20;
              }
              else {
                p_Var16 = context->args->filter;
                if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_11d0->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var16)(&args);
                }
                auVar27._8_8_ = uStack_11e0;
                auVar27._0_8_ = local_11e8;
                auVar54._0_4_ = -(uint)((int)local_11e8 == 0);
                auVar54._4_4_ = -(uint)((int)((ulong)local_11e8 >> 0x20) == 0);
                auVar54._8_4_ = -(uint)((int)uStack_11e0 == 0);
                auVar54._12_4_ = -(uint)((int)((ulong)uStack_11e0 >> 0x20) == 0);
                auVar69 = auVar54 ^ _DAT_01febe20;
                if (auVar27 != (undefined1  [16])0x0) {
                  auVar67 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar67;
                  auVar67 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar54);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar67;
                }
              }
              if ((_DAT_01fecb20 & auVar69) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar31;
              }
              valid.field_0.v[local_11c8] = 0.0;
              fVar126 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(local_1098._4_4_ <= fVar126) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(local_1098._0_4_ <= fVar126) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(local_1098._8_4_ <= fVar126) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(local_1098._12_4_ <= fVar126) & valid.field_0.i[3];
              uVar33 = local_11c8;
              uVar38 = local_11b8;
              lVar40 = local_11c0;
              auVar106 = local_1098;
            }
            iVar30 = movmskps((int)uVar33,(undefined1  [16])valid.field_0);
            if (iVar30 == 0) goto LAB_0026886c;
            auVar82 = blendvps(_DAT_01feb9f0,auVar106,(undefined1  [16])valid.field_0);
            auVar98._4_4_ = auVar82._0_4_;
            auVar98._0_4_ = auVar82._4_4_;
            auVar98._8_4_ = auVar82._12_4_;
            auVar98._12_4_ = auVar82._8_4_;
            auVar67 = minps(auVar98,auVar82);
            auVar70._0_8_ = auVar67._8_8_;
            auVar70._8_4_ = auVar67._0_4_;
            auVar70._12_4_ = auVar67._4_4_;
            auVar67 = minps(auVar70,auVar67);
            auVar71._0_8_ =
                 CONCAT44(-(uint)(auVar67._4_4_ == auVar82._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar67._0_4_ == auVar82._0_4_) & valid.field_0._0_4_);
            auVar71._8_4_ = -(uint)(auVar67._8_4_ == auVar82._8_4_) & valid.field_0._8_4_;
            auVar71._12_4_ = -(uint)(auVar67._12_4_ == auVar82._12_4_) & valid.field_0._12_4_;
            iVar30 = movmskps(iVar30,auVar71);
            aVar55 = valid.field_0;
            if (iVar30 != 0) {
              aVar55.i[2] = auVar71._8_4_;
              aVar55._0_8_ = auVar71._0_8_;
              aVar55.i[3] = auVar71._12_4_;
            }
            uVar31 = movmskps(iVar30,(undefined1  [16])aVar55);
            uVar33 = CONCAT44((int)(uVar33 >> 0x20),uVar31);
            local_11c8 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> local_11c8 & 1) == 0; local_11c8 = local_11c8 + 1) {
              }
            }
            goto LAB_002689a2;
          }
        }
LAB_0026886c:
        lVar42 = lVar42 + 1;
      } while (lVar42 != lVar40);
    }
    iVar30 = *(int *)(ray + k * 4 + 0x80);
    uVar35 = local_11a8;
    fVar126 = local_1028;
    fVar116 = fStack_1024;
    fVar120 = fStack_1020;
    fVar127 = fStack_101c;
    fVar80 = local_1038;
    fVar65 = fStack_1034;
    fVar46 = fStack_1030;
    fVar88 = fStack_102c;
    fVar73 = local_1048;
    fVar58 = fStack_1044;
    fVar91 = fStack_1040;
    fVar75 = fStack_103c;
    fVar61 = local_1058;
    fVar94 = fStack_1054;
    fVar77 = fStack_1050;
    fVar64 = fStack_104c;
    fVar95 = local_1068;
    fVar99 = fStack_1064;
    fVar100 = fStack_1060;
    fVar101 = fStack_105c;
    fVar102 = local_1078;
    fVar107 = fStack_1074;
    fVar108 = fStack_1070;
    fVar109 = fStack_106c;
    iVar138 = local_1088;
    iVar139 = iStack_1084;
    iVar140 = iStack_1080;
    iVar141 = iStack_107c;
    iVar72 = iVar30;
    iVar74 = iVar30;
    iVar76 = iVar30;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }